

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

void fmt::v10::detail::parse_flags<char>(format_specs<char> *specs,char **it,char *end)

{
  char *pcVar1;
  char *end_local;
  char **it_local;
  format_specs<char> *specs_local;
  
  while (*it != end) {
    switch(**it) {
    case ' ':
      if (((byte)(*(ushort *)&specs->field_0x9 >> 4) & 7) != 2) {
        *(ushort *)&specs->field_0x9 = *(ushort *)&specs->field_0x9 & 0xff8f | 0x30;
      }
      break;
    default:
      return;
    case '#':
      *(ushort *)&specs->field_0x9 = *(ushort *)&specs->field_0x9 & 0xff7f | 0x80;
      break;
    case '+':
      *(ushort *)&specs->field_0x9 = *(ushort *)&specs->field_0x9 & 0xff8f | 0x20;
      break;
    case '-':
      *(ushort *)&specs->field_0x9 = *(ushort *)&specs->field_0x9 & 0xfff0 | 1;
      break;
    case '0':
      pcVar1 = fill_t<char>::operator[](&specs->fill,0);
      *pcVar1 = '0';
    }
    *it = *it + 1;
  }
  return;
}

Assistant:

void parse_flags(format_specs<Char>& specs, const Char*& it, const Char* end) {
  for (; it != end; ++it) {
    switch (*it) {
    case '-':
      specs.align = align::left;
      break;
    case '+':
      specs.sign = sign::plus;
      break;
    case '0':
      specs.fill[0] = '0';
      break;
    case ' ':
      if (specs.sign != sign::plus) specs.sign = sign::space;
      break;
    case '#':
      specs.alt = true;
      break;
    default:
      return;
    }
  }
}